

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMacro.h
# Opt level: O0

void __thiscall CMacro::~CMacro(CMacro *this)

{
  CMacro *this_local;
  
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&this->arguments);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&this->lines);
  std::__cxx11::wstring::~wstring((wstring *)this);
  return;
}

Assistant:

CMacro(void) { counter = 0; }